

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

RtMidiInPtr rtmidi_in_create_default(void)

{
  RtMidiInPtr pRVar1;
  RtMidiIn *this;
  allocator<char> local_41;
  string local_40;
  
  pRVar1 = (RtMidiInPtr)operator_new(0x20);
  this = (RtMidiIn *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"RtMidi Input Client",&local_41);
  RtMidiIn::RtMidiIn(this,UNSPECIFIED,&local_40,100);
  std::__cxx11::string::~string((string *)&local_40);
  pRVar1->ptr = this;
  pRVar1->data = (void *)0x0;
  pRVar1->ok = true;
  pRVar1->msg = "";
  return pRVar1;
}

Assistant:

RtMidiInPtr rtmidi_in_create_default ()
{
    RtMidiWrapper* wrp = new RtMidiWrapper;

    try {
        RtMidiIn* rIn = new RtMidiIn ();

        wrp->ptr = (void*) rIn;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }

    return wrp;
}